

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_bigint.h
# Opt level: O0

void __thiscall absl::strings_internal::BigUnsigned<4>::MultiplyBy(BigUnsigned<4> *this,uint32_t v)

{
  uint in_ESI;
  BigUnsigned<4> *in_RDI;
  int i;
  uint64_t window;
  uint64_t factor;
  int local_24;
  ulong local_20;
  
  if ((in_RDI->size_ != 0) && (in_ESI != 1)) {
    if (in_ESI == 0) {
      SetToZero(in_RDI);
    }
    else {
      local_20 = 0;
      for (local_24 = 0; local_24 < in_RDI->size_; local_24 = local_24 + 1) {
        local_20 = (ulong)in_ESI * (ulong)in_RDI->words_[local_24] + local_20;
        in_RDI->words_[local_24] = (uint32_t)local_20;
        local_20 = local_20 >> 0x20;
      }
      if ((local_20 != 0) && (in_RDI->size_ < 4)) {
        in_RDI->words_[in_RDI->size_] = (uint32_t)local_20;
        in_RDI->size_ = in_RDI->size_ + 1;
      }
    }
  }
  return;
}

Assistant:

void MultiplyBy(uint32_t v) {
    if (size_ == 0 || v == 1) {
      return;
    }
    if (v == 0) {
      SetToZero();
      return;
    }
    const uint64_t factor = v;
    uint64_t window = 0;
    for (int i = 0; i < size_; ++i) {
      window += factor * words_[i];
      words_[i] = window & 0xffffffff;
      window >>= 32;
    }
    // If carry bits remain and there's space for them, grow size_.
    if (window && size_ < max_words) {
      words_[size_] = window & 0xffffffff;
      ++size_;
    }
  }